

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O1

array_n<bool,_2,_std::allocator<bool>_> * __thiscall
sisl::array_n<bool,_2,_std::allocator<bool>_>::operator=
          (array_n<bool,_2,_std::allocator<bool>_> *this,
          array_n<bool,_2,_std::allocator<bool>_> *obj)

{
  uint uVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool *pbVar4;
  long lVar5;
  array_n<bool,_2,_std::allocator<bool>_> copy;
  array_n<bool,_2,_std::allocator<bool>_> local_28;
  
  array_n(&local_28,obj);
  lVar5 = 2;
  do {
    uVar1 = this->_dims[lVar5 + -2];
    this->_dims[lVar5 + -2] = local_28._dims[lVar5 + -2];
    local_28._dims[lVar5 + -2] = uVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 3);
  pbVar2 = this->first;
  this->first = local_28.first;
  pbVar3 = this->last;
  this->last = local_28.last;
  pbVar4 = this->_array;
  this->_array = local_28._array;
  local_28._array = pbVar4;
  local_28.first = pbVar2;
  local_28.last = pbVar3;
  ~array_n(&local_28);
  return this;
}

Assistant:

array_n &operator=(const array_n &obj){
            array_n copy(obj);

            for(int i = 0; i < N; i++) {
                std::swap(_dims[i], copy._dims[i]);
            }
            std::swap(first, copy.first);
            std::swap(last, copy.last);
            std::swap(_array, copy._array);

            return *this;
        }